

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_jmp_tb(DisasContext_conflict2 *s,int n,uint32_t dest)

{
  TCGContext_conflict2 *tcg_ctx_00;
  _Bool _Var1;
  TCGContext_conflict2 *tcg_ctx;
  uint32_t dest_local;
  int n_local;
  DisasContext_conflict2 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (((s->base).singlestep_enabled & 1U) == 0) {
    _Var1 = use_goto_tb(s,dest);
    if (_Var1) {
      tcg_gen_goto_tb_m68k(tcg_ctx_00,n);
      tcg_gen_movi_i32(tcg_ctx_00,QREG_PC,dest);
      tcg_gen_exit_tb_m68k(tcg_ctx_00,(TranslationBlock *)(s->base).tb,n);
    }
    else {
      gen_jmp_im(s,dest);
      tcg_gen_exit_tb_m68k(tcg_ctx_00,(TranslationBlock *)0x0,0);
    }
  }
  else {
    gen_exception(s,dest,0x10002);
  }
  (s->base).is_jmp = DISAS_NORETURN;
  return;
}

Assistant:

static void gen_jmp_tb(DisasContext *s, int n, uint32_t dest)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (unlikely(s->base.singlestep_enabled)) {
        gen_exception(s, dest, EXCP_DEBUG);
    } else if (use_goto_tb(s, dest)) {
        tcg_gen_goto_tb(tcg_ctx, n);
        tcg_gen_movi_i32(tcg_ctx, QREG_PC, dest);
        tcg_gen_exit_tb(tcg_ctx, s->base.tb, n);
    } else {
        gen_jmp_im(s, dest);
        tcg_gen_exit_tb(tcg_ctx, NULL, 0);
    }
    s->base.is_jmp = DISAS_NORETURN;
}